

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::Select(w3Interp *this)

{
  w3Stack *this_00;
  pointer *ppwVar1;
  size_t *psVar2;
  int iVar3;
  undefined1 *puVar4;
  char extraout_AL;
  char cVar5;
  Value *pVVar6;
  pointer pwVar7;
  long lVar8;
  undefined8 extraout_RAX;
  long lVar9;
  ulong uVar10;
  undefined1 *puVar11;
  w3Stack *pwVar12;
  w3Stack *pwVar13;
  pointer *unaff_R15;
  w3StackValue val2;
  undefined1 auStack_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a0;
  size_t sStack_90;
  size_t sStack_88;
  w3Stack *pwStack_78;
  w3StackValue local_58;
  
  this_00 = &this->super_w3Stack;
  pVVar6 = w3Stack::value(this_00,Tag_i32);
  iVar3 = pVVar6->i32;
  w3Stack::AssertTopIsValue(this_00);
  pwVar7 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
  super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = pwVar7 + -1;
  if (iVar3 == 0) {
    local_58.tag = pwVar7[-2].tag;
    local_58._1_7_ = *(undefined7 *)&pwVar7[-2].field_0x1;
    local_58.value.tag = pwVar7[-2].value.tag;
    local_58.value._1_7_ = *(undefined7 *)&pwVar7[-2].value.field_0x1;
    local_58.value.value = pwVar7[-2].value.value;
    local_58.frame = pwVar7[-2].frame;
    local_58.label.arity = pwVar7[-2].label.arity;
    local_58.label.continuation = pwVar7[-2].label.continuation;
    w3Stack::AssertTopIsValue(this_00);
    ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
               super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppwVar1 = *ppwVar1 + -1;
    w3Stack::AssertTopIsValue(this_00);
    ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
               super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppwVar1 = *ppwVar1 + -1;
    w3Stack::push_value(this_00,&local_58);
    return;
  }
  pwVar12 = this_00;
  w3Stack::AssertTopIsValue(this_00);
  pwVar7 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
  super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = pwVar7;
  if (pwVar7 != (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                super__Vector_impl_data._M_start) {
    w3Stack::AssertTopIsValue(this_00);
    return;
  }
  Select();
  pwVar13 = (w3Stack *)auStack_b0;
  puVar11 = (undefined1 *)
            (ulong)*(uint *)(pwVar12->super_w3StackBase).super_w3StackBaseBase.
                            super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                            super__Vector_impl_data._M_finish;
  pwStack_78 = this_00;
  if (puVar11 < *(undefined1 **)(*(long *)((long)(pwVar12 + 2) + 8) + 0x30)) {
    unaff_R15 = &(pwVar12->super_w3StackBase).super_w3StackBaseBase.
                 super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    lVar8 = *(long *)(*(long *)((long)(pwVar12 + 2) + 8) + 0x58) * 0x30 +
            **(long **)(*(long *)(*(long *)((long)(pwVar12 + 2) + 8) + 0x50) + 0x40);
    lVar9 = (long)puVar11 * 0x30;
    auStack_b0._0_8_ = *(undefined8 *)(lVar9 + lVar8);
    auStack_b0._8_8_ = ((undefined8 *)(lVar9 + lVar8))[1];
    pVVar6 = (Value *)(lVar9 + 0x10 + lVar8);
    aStack_a0._M_allocated_capacity = (size_type)*pVVar6;
    aStack_a0._8_8_ = pVVar6[1];
    psVar2 = (size_t *)(lVar9 + 0x20 + lVar8);
    sStack_90 = *psVar2;
    sStack_88 = psVar2[1];
    w3Stack::push_value((w3Stack *)unaff_R15,(w3StackValue *)auStack_b0);
    puVar4 = *(undefined1 **)(*(long *)((long)(pwVar12 + 2) + 8) + 0x20);
    w3Stack::AssertTopIsValue((w3Stack *)unaff_R15);
    uVar10 = *(ulong *)((long)(pwVar12 + 2) + 8);
    cVar5 = *(char *)&(*(w3Module **)(pwVar12 + 1))[-1].main;
    if (puVar11 < puVar4) {
      if (cVar5 == puVar11[*(long *)(uVar10 + 0x40)]) {
        return;
      }
      w3Stack::AssertTopIsValue((w3Stack *)unaff_R15);
      uVar10 = (ulong)(byte)puVar11[*(long *)(*(long *)((long)(pwVar12 + 2) + 8) + 0x40)];
      StringFormat_abi_cxx11_
                ((string *)auStack_b0,"%X %X",
                 (ulong)*(byte *)&(*(w3Module **)(pwVar12 + 1))[-1].main);
      AssertFailedFormat("tag () == frame->param_types [i]",(string *)auStack_b0);
      puVar11 = auStack_b0;
      cVar5 = extraout_AL;
    }
    pwVar13 = pwVar12;
    if (cVar5 == puVar11[*(long *)(uVar10 + 0x38) - *(long *)(uVar10 + 0x20)]) {
      return;
    }
  }
  else {
    StringFormat_abi_cxx11_((string *)auStack_b0,"%lX %lX",puVar11);
    AssertFailedFormat("i < frame->param_and_local_count",(string *)auStack_b0);
  }
  w3Stack::AssertTopIsValue((w3Stack *)unaff_R15);
  StringFormat_abi_cxx11_
            ((string *)auStack_b0,"%X %X",(ulong)*(byte *)&(*(w3Module **)(pwVar13 + 1))[-1].main,
             (ulong)(byte)puVar11[*(long *)(*(long *)((long)(pwVar13 + 2) + 8) + 0x38) -
                                  *(long *)(*(long *)((long)(pwVar13 + 2) + 8) + 0x20)]);
  AssertFailedFormat("tag () == frame->local_only_types [i - frame->param_count]",
                     (string *)auStack_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_b0._0_8_ != &aStack_a0) {
    operator_delete((void *)auStack_b0._0_8_,aStack_a0._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

INTERP (Select)
{
    if (pop_i32 ())
    {
        pop_value ();
        Assert (size () >= 1);
        AssertTopIsValue ();
    }
    else
    {
        const w3StackValue val2 = top ();
        pop_value ();
        pop_value ();
        push_value (val2);
    }
}